

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O3

void slang::ast::ClockVarSymbol::fromSyntax
               (Scope *scope,ClockingItemSyntax *syntax,
               SmallVectorBase<const_slang::ast::ClockVarSymbol_*> *results)

{
  Scope *pSVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  ClockingItemSyntax *pCVar3;
  int iVar4;
  ClockingDirectionSyntax *pCVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar6;
  ClockVarSymbol *this;
  undefined4 extraout_var;
  SourceLocation location;
  ValueSymbol *symbol;
  DeclaredType *target;
  Expression *pEVar7;
  Diagnostic *this_00;
  ulong uVar8;
  long lVar9;
  LookupLocation LVar10;
  ClockingSkew CVar11;
  string_view sVar12;
  SourceRange SVar13;
  LookupLocation location_00;
  ArgumentDirection dir;
  ClockVarSymbol *arg;
  ASTContext context;
  Token name;
  undefined1 isDottedAccess;
  ArgumentDirection local_124;
  ClockingItemSyntax *local_120;
  string_view local_118;
  uint32_t local_104;
  Compilation *local_100;
  ClockingSkew local_f8;
  ClockingSkew local_e8;
  Scope *local_d8;
  Scope *local_d0;
  SmallVectorBase<const_slang::ast::ClockVarSymbol_*> *local_c8;
  SourceLocation local_c0;
  undefined1 local_b8 [16];
  bitmask<slang::ast::ASTFlags> local_a8;
  Symbol *pSStack_a0;
  SourceLocation SStack_98;
  SourceLocation local_90;
  ValueSymbol *pVStack_88;
  SourceRange local_78;
  undefined1 local_68 [16];
  bitmask<slang::ast::ASTFlags> local_58;
  Symbol *pSStack_50;
  SourceLocation local_48;
  SourceLocation SStack_40;
  ValueSymbol *local_38;
  
  local_100 = scope->compilation;
  pSVar1 = scope->thisSym->parentScope;
  local_c8 = results;
  LVar10 = LookupLocation::before(scope->thisSym);
  local_d8 = LVar10.scope;
  local_104 = LVar10.index;
  local_b8._8_4_ = local_104;
  local_a8.m_bits = 0x20;
  pSStack_a0 = (Symbol *)0x0;
  SStack_98 = (SourceLocation)0x0;
  local_90 = (SourceLocation)0x0;
  pVStack_88 = (ValueSymbol *)0x0;
  local_124 = In;
  local_e8.edge = None;
  local_e8.delay = (TimingControl *)0x0;
  local_f8.edge = None;
  local_f8.delay = (TimingControl *)0x0;
  pCVar5 = (syntax->direction).ptr;
  local_120 = syntax;
  local_b8._0_8_ = pSVar1;
  if ((pCVar5->input).kind == InOutKeyword) {
    local_124 = InOut;
  }
  else {
    if (((pCVar5->input).info != (Info *)0x0) && (pCVar5->inputSkew != (ClockingSkewSyntax *)0x0)) {
      CVar11 = ClockingSkew::fromSyntax
                         ((ClockingSkew *)pCVar5->inputSkew,(ClockingSkewSyntax *)local_b8,
                          LVar10._8_8_);
      local_e8.delay = CVar11.delay;
      LVar10._8_8_ = local_e8.delay;
      LVar10.scope = local_d8;
      local_e8.edge = CVar11.edge;
      pCVar5 = (local_120->direction).ptr;
    }
    local_d8 = LVar10.scope;
    if ((pCVar5->output).info == (Info *)0x0) goto LAB_007c43ba;
    local_124 = InOut - ((pCVar5->input).info == (Info *)0x0);
    if (pCVar5->outputSkew != (ClockingSkewSyntax *)0x0) {
      CVar11 = ClockingSkew::fromSyntax
                         ((ClockingSkew *)pCVar5->outputSkew,(ClockingSkewSyntax *)local_b8,
                          LVar10._8_8_);
      local_f8.delay = CVar11.delay;
      local_f8.edge = CVar11.edge;
    }
  }
  ASTContext::resetFlags
            ((ASTContext *)local_68,(ASTContext *)local_b8,(bitmask<slang::ast::ASTFlags>)0x100000);
  pVStack_88 = local_38;
  SStack_98 = local_48;
  local_90 = SStack_40;
  local_a8.m_bits = local_58.m_bits;
  pSStack_a0 = pSStack_50;
  local_b8._0_8_ = local_68._0_8_;
  local_b8._8_8_ = local_68._8_8_;
LAB_007c43ba:
  uVar8 = (local_120->decls).elements._M_extent._M_extent_value + 1;
  if (1 < uVar8) {
    uVar8 = uVar8 >> 1;
    lVar9 = 0;
    local_d0 = pSVar1;
    do {
      pCVar3 = local_120;
      ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((local_120->decls).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar9));
      pSVar2 = *ppSVar6;
      local_68._0_8_ = *(undefined8 *)(pSVar2 + 1);
      local_68._8_8_ = pSVar2[1].parent;
      local_118 = parsing::Token::valueText((Token *)local_68);
      local_c0 = parsing::Token::location((Token *)local_68);
      this = BumpAllocator::
             emplace<slang::ast::ClockVarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&,slang::ast::ClockingSkew&,slang::ast::ClockingSkew&>
                       (&local_100->super_BumpAllocator,&local_118,&local_c0,&local_124,&local_e8,
                        &local_f8);
      pSVar1 = local_d0;
      local_118._M_len = (size_t)this;
      (this->super_VariableSymbol).super_ValueSymbol.super_Symbol.originatingSyntax = pSVar2;
      syntax_00._M_ptr =
           (pCVar3->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (pCVar3->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes((Symbol *)this,local_d0,syntax_00);
      SmallVectorBase<slang::ast::ClockVarSymbol_const*>::
      emplace_back<slang::ast::ClockVarSymbol_const*const&>
                ((SmallVectorBase<slang::ast::ClockVarSymbol_const*> *)local_c8,
                 (ClockVarSymbol **)&local_118);
      if (pSVar2[1].previewNode == (SyntaxNode *)0x0) {
        sVar12 = parsing::Token::valueText((Token *)local_68);
        local_78 = parsing::Token::range((Token *)local_68);
        isDottedAccess = local_78.endLoc._0_1_;
        location_00.index = local_104;
        location_00.scope = local_d8;
        location_00._12_4_ = 0;
        symbol = (ValueSymbol *)
                 Lookup::unqualifiedAt
                           (pSVar1,sVar12,location_00,local_78,(bitmask<slang::ast::LookupFlags>)0x0
                           );
        if (symbol != (ValueSymbol *)0x0) {
          if ((symbol->super_Symbol).kind - Net < 2) {
            target = Symbol::getDeclaredType((Symbol *)symbol);
            DeclaredType::setLink((DeclaredType *)(local_118._M_len + 0x40),target);
            SVar13.startLoc =
                 *(long *)(local_118._M_len + 8) * 0x10000000 +
                 (long)*(HierarchicalReference **)(local_118._M_len + 0x18);
            SVar13.endLoc = (SourceLocation)0x0;
            pEVar7 = ValueExpressionBase::fromSymbol
                               ((ValueExpressionBase *)local_b8,(ASTContext *)symbol,(Symbol *)0x0,
                                *(HierarchicalReference **)(local_118._M_len + 0x18),SVar13,false,
                                (bool)isDottedAccess);
            if (local_124 != In) {
              ASTContext::addDriver
                        ((ASTContext *)local_b8,symbol,pEVar7,(bitmask<slang::ast::AssignFlags>)0x20
                        );
            }
            goto LAB_007c4616;
          }
          SVar13 = parsing::Token::range((Token *)local_68);
          this_00 = ASTContext::addDiag((ASTContext *)local_b8,(DiagCode)0x550006,SVar13);
          sVar12 = parsing::Token::valueText((Token *)local_68);
          Diagnostic::operator<<(this_00,sVar12);
          Diagnostic::addNote(this_00,(DiagCode)0x50001,(symbol->super_Symbol).location);
        }
        *(Type **)(local_118._M_len + 0x48) = local_100->errorType;
      }
      else {
        iVar4 = Expression::bind((int)pSVar2[1].previewNode[1].previewNode,(sockaddr *)local_b8,0);
        pEVar7 = (Expression *)CONCAT44(extraout_var,iVar4);
        *(Type **)(local_118._M_len + 0x48) = (pEVar7->type).ptr;
        *(Expression **)(local_118._M_len + 0x60) = pEVar7;
        if (local_124 != In) {
          location = parsing::Token::location((Token *)(pSVar2[1].previewNode + 1));
          Expression::requireLValue
                    (pEVar7,(ASTContext *)local_b8,location,(bitmask<slang::ast::AssignFlags>)0x20,
                     (Expression *)0x0);
        }
      }
LAB_007c4616:
      lVar9 = lVar9 + 0x30;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

void ClockVarSymbol::fromSyntax(const Scope& scope, const ClockingItemSyntax& syntax,
                                SmallVectorBase<const ClockVarSymbol*>& results) {
    // Lookups should happen in the parent of the clocking block, since other
    // clocking block members cannot reference each other.
    auto& comp = scope.getCompilation();
    auto parent = scope.asSymbol().getParentScope();
    SLANG_ASSERT(parent);

    LookupLocation ll = LookupLocation::before(scope.asSymbol());
    ASTContext context(*parent, ll, ASTFlags::NonProcedural);

    ArgumentDirection dir = ArgumentDirection::In;
    ClockingSkew inputSkew, outputSkew;
    if (syntax.direction->input.kind == TokenKind::InOutKeyword) {
        dir = ArgumentDirection::InOut;
    }
    else {
        if (syntax.direction->input) {
            if (syntax.direction->inputSkew)
                inputSkew = ClockingSkew::fromSyntax(*syntax.direction->inputSkew, context);
        }

        if (syntax.direction->output) {
            dir = syntax.direction->input ? ArgumentDirection::InOut : ArgumentDirection::Out;
            if (syntax.direction->outputSkew)
                outputSkew = ClockingSkew::fromSyntax(*syntax.direction->outputSkew, context);
        }
    }

    if (dir == ArgumentDirection::Out || dir == ArgumentDirection::InOut)
        context = context.resetFlags(ASTFlags::LValue);

    for (auto decl : syntax.decls) {
        auto name = decl->name;
        auto arg = comp.emplace<ClockVarSymbol>(name.valueText(), name.location(), dir, inputSkew,
                                                outputSkew);
        arg->setSyntax(*decl);
        arg->setAttributes(*parent, syntax.attributes);
        results.push_back(arg);

        // If there is an initializer expression we take our type from that.
        // Otherwise we need to lookup the signal in our parent scope and
        // take the type from that.
        if (decl->value) {
            auto& expr = Expression::bind(*decl->value->expr, context);
            arg->setType(*expr.type);
            arg->setInitializer(expr);

            if (dir != ArgumentDirection::In)
                expr.requireLValue(context, decl->value->equals.location(), AssignFlags::ClockVar);
        }
        else {
            auto sym = Lookup::unqualifiedAt(*parent, name.valueText(), ll, name.range());
            if (sym && sym->kind != SymbolKind::Net && sym->kind != SymbolKind::Variable) {
                auto& diag = context.addDiag(diag::InvalidClockingSignal, name.range());
                diag << name.valueText();
                diag.addNote(diag::NoteDeclarationHere, sym->location);
                sym = nullptr;
            }

            if (sym) {
                auto sourceType = sym->getDeclaredType();
                SLANG_ASSERT(sourceType);
                arg->getDeclaredType()->setLink(*sourceType);

                auto& valExpr = ValueExpressionBase::fromSymbol(
                    context, *sym, nullptr, {arg->location, arg->location + arg->name.length()});

                if (dir != ArgumentDirection::In)
                    context.addDriver(sym->as<ValueSymbol>(), valExpr, AssignFlags::ClockVar);
            }
            else {
                arg->getDeclaredType()->setType(comp.getErrorType());
            }
        }
    }
}